

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.c
# Opt level: O2

int property_set(char *key,char *value)

{
  size_t sVar1;
  ssize_t sVar2;
  int iVar3;
  char recvBuf [1];
  char sendBuf [125];
  
  pthread_once(&gInitOnce,init);
  iVar3 = -1;
  if (-1 < gPropFd) {
    sVar1 = strlen(key);
    if (sVar1 < 0x20) {
      sVar1 = strlen(value);
      if (sVar1 < 0x5c) {
        sendBuf[8] = -0x23;
        sendBuf[9] = -0x23;
        sendBuf[10] = -0x23;
        sendBuf[0xb] = -0x23;
        sendBuf[0xc] = -0x23;
        sendBuf[0xd] = -0x23;
        sendBuf[0xe] = -0x23;
        sendBuf[0xf] = -0x23;
        sendBuf[0x70] = -0x23;
        sendBuf[0x71] = -0x23;
        sendBuf[0x72] = -0x23;
        sendBuf[0x73] = -0x23;
        sendBuf[0x74] = -0x23;
        sendBuf[0x75] = -0x23;
        sendBuf[0x76] = -0x23;
        sendBuf[0x77] = -0x23;
        sendBuf[0x78] = -0x23;
        sendBuf[0x79] = -0x23;
        sendBuf[0x7a] = -0x23;
        sendBuf[0x7b] = -0x23;
        sendBuf[0x7c] = -0x23;
        sendBuf[0x60] = -0x23;
        sendBuf[0x61] = -0x23;
        sendBuf[0x62] = -0x23;
        sendBuf[99] = -0x23;
        sendBuf[100] = -0x23;
        sendBuf[0x65] = -0x23;
        sendBuf[0x66] = -0x23;
        sendBuf[0x67] = -0x23;
        sendBuf[0x68] = -0x23;
        sendBuf[0x69] = -0x23;
        sendBuf[0x6a] = -0x23;
        sendBuf[0x6b] = -0x23;
        sendBuf[0x6c] = -0x23;
        sendBuf[0x6d] = -0x23;
        sendBuf[0x6e] = -0x23;
        sendBuf[0x6f] = -0x23;
        sendBuf[0x50] = -0x23;
        sendBuf[0x51] = -0x23;
        sendBuf[0x52] = -0x23;
        sendBuf[0x53] = -0x23;
        sendBuf[0x54] = -0x23;
        sendBuf[0x55] = -0x23;
        sendBuf[0x56] = -0x23;
        sendBuf[0x57] = -0x23;
        sendBuf[0x58] = -0x23;
        sendBuf[0x59] = -0x23;
        sendBuf[0x5a] = -0x23;
        sendBuf[0x5b] = -0x23;
        sendBuf[0x5c] = -0x23;
        sendBuf[0x5d] = -0x23;
        sendBuf[0x5e] = -0x23;
        sendBuf[0x5f] = -0x23;
        sendBuf[0x40] = -0x23;
        sendBuf[0x41] = -0x23;
        sendBuf[0x42] = -0x23;
        sendBuf[0x43] = -0x23;
        sendBuf[0x44] = -0x23;
        sendBuf[0x45] = -0x23;
        sendBuf[0x46] = -0x23;
        sendBuf[0x47] = -0x23;
        sendBuf[0x48] = -0x23;
        sendBuf[0x49] = -0x23;
        sendBuf[0x4a] = -0x23;
        sendBuf[0x4b] = -0x23;
        sendBuf[0x4c] = -0x23;
        sendBuf[0x4d] = -0x23;
        sendBuf[0x4e] = -0x23;
        sendBuf[0x4f] = -0x23;
        sendBuf[0x30] = -0x23;
        sendBuf[0x31] = -0x23;
        sendBuf[0x32] = -0x23;
        sendBuf[0x33] = -0x23;
        sendBuf[0x34] = -0x23;
        sendBuf[0x35] = -0x23;
        sendBuf[0x36] = -0x23;
        sendBuf[0x37] = -0x23;
        sendBuf[0x38] = -0x23;
        sendBuf[0x39] = -0x23;
        sendBuf[0x3a] = -0x23;
        sendBuf[0x3b] = -0x23;
        sendBuf[0x3c] = -0x23;
        sendBuf[0x3d] = -0x23;
        sendBuf[0x3e] = -0x23;
        sendBuf[0x3f] = -0x23;
        sendBuf[0x20] = -0x23;
        sendBuf[0x21] = -0x23;
        sendBuf[0x22] = -0x23;
        sendBuf[0x23] = -0x23;
        sendBuf[0x24] = -0x23;
        sendBuf[0x25] = -0x23;
        sendBuf[0x26] = -0x23;
        sendBuf[0x27] = -0x23;
        sendBuf[0x28] = -0x23;
        sendBuf[0x29] = -0x23;
        sendBuf[0x2a] = -0x23;
        sendBuf[0x2b] = -0x23;
        sendBuf[0x2c] = -0x23;
        sendBuf[0x2d] = -0x23;
        sendBuf[0x2e] = -0x23;
        sendBuf[0x2f] = -0x23;
        sendBuf[0x10] = -0x23;
        sendBuf[0x11] = -0x23;
        sendBuf[0x12] = -0x23;
        sendBuf[0x13] = -0x23;
        sendBuf[0x14] = -0x23;
        sendBuf[0x15] = -0x23;
        sendBuf[0x16] = -0x23;
        sendBuf[0x17] = -0x23;
        sendBuf[0x18] = -0x23;
        sendBuf[0x19] = -0x23;
        sendBuf[0x1a] = -0x23;
        sendBuf[0x1b] = -0x23;
        sendBuf[0x1c] = -0x23;
        sendBuf[0x1d] = -0x23;
        sendBuf[0x1e] = -0x23;
        sendBuf[0x1f] = -0x23;
        sendBuf[0] = '\x02';
        sendBuf[1] = -0x23;
        sendBuf[2] = -0x23;
        sendBuf[3] = -0x23;
        sendBuf[4] = -0x23;
        sendBuf[5] = -0x23;
        sendBuf[6] = -0x23;
        sendBuf[7] = -0x23;
        strcpy(sendBuf + 1,key);
        strcpy(sendBuf + 0x21,value);
        pthread_mutex_lock((pthread_mutex_t *)&gPropertyFdLock);
        sVar2 = write(gPropFd,sendBuf,0x7d);
        if (sVar2 == 0x7d) {
          sVar2 = read(gPropFd,recvBuf,1);
          pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
          if (sVar2 == 1) {
            iVar3 = -(uint)(recvBuf[0] != '\x01');
          }
        }
        else {
          pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int property_set(const char *key, const char *value)
{
    char sendBuf[1+PROPERTY_KEY_MAX+PROPERTY_VALUE_MAX];
    char recvBuf[1];
    int result = -1;

    //LOGV("PROPERTY SET [%s]: [%s]\n", key, value);

    pthread_once(&gInitOnce, init);
    if (gPropFd < 0)
        return -1;

    if (strlen(key) >= PROPERTY_KEY_MAX) return -1;
    if (strlen(value) >= PROPERTY_VALUE_MAX) return -1;

    memset(sendBuf, 0xdd, sizeof(sendBuf));    // placate valgrind

    sendBuf[0] = (char) kSystemPropertySet;
    strcpy(sendBuf+1, key);
    strcpy(sendBuf+1+PROPERTY_KEY_MAX, value);

    pthread_mutex_lock(&gPropertyFdLock);
    if (write(gPropFd, sendBuf, sizeof(sendBuf)) != sizeof(sendBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    if (read(gPropFd, recvBuf, sizeof(recvBuf)) != sizeof(recvBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    pthread_mutex_unlock(&gPropertyFdLock);

    if (recvBuf[0] != 1)
        return -1;
    return 0;
}